

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void in1_r3_32u(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *s_00;
  TCGTemp *pTVar1;
  
  s_00 = s->uc->tcg_ctx;
  pTVar1 = tcg_temp_new_internal_s390x(s_00,TCG_TYPE_I64,false);
  o->in1 = (TCGv_i64)((long)pTVar1 - (long)s_00);
  if (((s->fields).presentO & 4) != 0) {
    tcg_gen_ext32u_i64_s390x
              (s_00,(TCGv_i64)((long)pTVar1 - (long)s_00),s_00->regs[(s->fields).c[2]]);
    return;
  }
  __assert_fail("have_field1(s, o)",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate.c"
                ,0x44d,
                "int get_field1(const DisasContext *, enum DisasFieldIndexO, enum DisasFieldIndexC)"
               );
}

Assistant:

static void in1_r3_32u(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    o->in1 = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_ext32u_i64(tcg_ctx, o->in1, tcg_ctx->regs[get_field(s, r3)]);
}